

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_reader.cc
# Opt level: O3

intmax_t __thiscall pstack::Dwarf::DWARFReader::readFormSigned(DWARFReader *this,Form form)

{
  ostringstream *this_00;
  Exception *this_01;
  Exception local_1c0;
  
  this_01 = (Exception *)__cxa_allocate_exception(0x1a0);
  memset(&local_1c0,0,0x1a0);
  Exception::Exception(&local_1c0);
  this_00 = &local_1c0.str;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"unhandled form ",0xf);
  std::ostream::operator<<(this_00,form);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," when reading signed",0x14)
  ;
  Exception::Exception(this_01,&local_1c0);
  __cxa_throw(this_01,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

intmax_t
DWARFReader::readFormSigned(Form form)
{
    (void)this; // avoid warnings about making this static.
    switch (form) {
        default:
            throw (Exception() << "unhandled form " << form << " when reading signed");
    }
}